

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineoption.cpp
# Opt level: O2

void __thiscall QCommandLineOption::setFlags(QCommandLineOption *this,Flags flags)

{
  QCommandLineOptionPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QCommandLineOptionPrivate>::operator->(&this->d);
  (pQVar1->flags).super_QFlagsStorageHelper<QCommandLineOption::Flag,_4>.
  super_QFlagsStorage<QCommandLineOption::Flag>.i =
       (Int)flags.super_QFlagsStorageHelper<QCommandLineOption::Flag,_4>.
            super_QFlagsStorage<QCommandLineOption::Flag>.i;
  return;
}

Assistant:

void QCommandLineOption::setFlags(Flags flags)
{
    d->flags = flags;
}